

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxy.cpp
# Opt level: O3

void __thiscall
Shell::EqualityProxy::getArgumentEqualityLiterals
          (EqualityProxy *this,uint cnt,LiteralStack *lits,Stack<Kernel::TermList> *vars1,
          Stack<Kernel::TermList> *vars2,OperatorType *symbolType)

{
  uint predicate;
  TermList TVar1;
  TermList TVar2;
  Literal *pLVar3;
  Literal **ppLVar4;
  TermList *pTVar5;
  Stack<Kernel::TermList> *args;
  uint uVar6;
  ulong uVar7;
  sockaddr *__addr;
  uint64_t local_48;
  sockaddr *local_40;
  TermList *local_38;
  
  lits->_cursor = lits->_stack;
  vars1->_cursor = vars1->_stack;
  vars2->_cursor = vars2->_stack;
  args = vars1;
  if (getArgumentEqualityLiterals(unsigned_int,Lib::Stack<Kernel::Literal*>&,Lib::Stack<Kernel::TermList>&,Lib::Stack<Kernel::TermList>&,Kernel::OperatorType*)
      ::localSubst == '\0') {
    getArgumentEqualityLiterals();
  }
  Kernel::Substitution::reset(&getArgumentEqualityLiterals::localSubst);
  if (cnt != 0) {
    uVar6 = 5;
    uVar7 = 0;
    do {
      if (uVar7 < symbolType->_typeArgsArity) {
        TVar1 = Kernel::AtomicSort::superSort();
      }
      else {
        args = (Stack<Kernel::TermList> *)symbolType->_key;
        TVar1._content = (uint64_t)(&args->_stack)[(uint)uVar7 - symbolType->_typeArgsArity];
      }
      __addr = (sockaddr *)(ulong)(uVar6 - 4);
      TVar2 = Kernel::AtomicSort::superSort();
      if (TVar1._content == TVar2._content) {
        Kernel::Substitution::bind
                  (&getArgumentEqualityLiterals::localSubst,(uint)uVar7 & 0x3fffffff,__addr,
                   (socklen_t)args);
        pTVar5 = vars1->_cursor;
        if (pTVar5 == vars1->_end) {
          Lib::Stack<Kernel::TermList>::expand(vars1);
          pTVar5 = vars1->_cursor;
        }
        pTVar5->_content = (uint64_t)__addr;
        vars1->_cursor = pTVar5 + 1;
        pTVar5 = vars2->_cursor;
        if (pTVar5 == vars2->_end) {
          Lib::Stack<Kernel::TermList>::expand(vars2);
          pTVar5 = vars2->_cursor;
        }
        pTVar5->_content = (uint64_t)__addr;
      }
      else {
        TVar1 = Kernel::SubstHelper::applyImpl<false,Kernel::Substitution>
                          (TVar1,&getArgumentEqualityLiterals::localSubst,false);
        predicate = getProxyPredicate(this);
        args = (Stack<Kernel::TermList> *)&local_48;
        local_48 = TVar1._content;
        local_40 = __addr;
        local_38 = (TermList *)(ulong)uVar6;
        pLVar3 = Kernel::Literal::create(predicate,3,false,(TermList *)args);
        ppLVar4 = lits->_cursor;
        if (ppLVar4 == lits->_end) {
          Lib::Stack<Kernel::Literal_*>::expand(lits);
          ppLVar4 = lits->_cursor;
        }
        *ppLVar4 = pLVar3;
        lits->_cursor = lits->_cursor + 1;
        pTVar5 = vars1->_cursor;
        if (pTVar5 == vars1->_end) {
          Lib::Stack<Kernel::TermList>::expand(vars1);
          pTVar5 = vars1->_cursor;
        }
        pTVar5->_content = (uint64_t)__addr;
        vars1->_cursor = pTVar5 + 1;
        pTVar5 = vars2->_cursor;
        if (pTVar5 == vars2->_end) {
          Lib::Stack<Kernel::TermList>::expand(vars2);
          pTVar5 = vars2->_cursor;
        }
        pTVar5->_content = (uint64_t)(ulong)uVar6;
      }
      vars2->_cursor = pTVar5 + 1;
      uVar7 = uVar7 + 1;
      uVar6 = uVar6 + 8;
    } while (cnt != uVar7);
  }
  return;
}

Assistant:

void EqualityProxy::getArgumentEqualityLiterals(unsigned cnt, LiteralStack& lits,
    Stack<TermList>& vars1, Stack<TermList>& vars2, OperatorType* symbolType)
{
  ASS_EQ(cnt, symbolType->arity());

  lits.reset();
  vars1.reset();
  vars2.reset();

  static Substitution localSubst;
  localSubst.reset();

  for (unsigned i=0; i<cnt; i++) {
    TermList v1(2*i, false);
    TermList v2(2*i+1, false);
    TermList sort = symbolType->arg(i);
    if(sort != AtomicSort::superSort()){
      lits.push(makeProxyLiteral(false, v1, v2, SubstHelper::apply(sort, localSubst)));
      vars1.push(v1);
      vars2.push(v2);
    } else {
      TermList var = symbolType->quantifiedVar(i);
      localSubst.bind(var.var(), v1);
      vars1.push(v1);
      vars2.push(v1);
    }
  }
}